

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t read_bytes_to_string(archive_read *a,archive_string *as,size_t size,size_t *unconsumed)

{
  archive_string *paVar1;
  void *__src;
  void *src;
  size_t *unconsumed_local;
  size_t size_local;
  archive_string *as_local;
  archive_read *a_local;
  
  paVar1 = archive_string_ensure(as,size + 1);
  if (paVar1 == (archive_string *)0x0) {
    archive_set_error(&a->archive,0xc,"No memory");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    tar_flush_unconsumed(a,unconsumed);
    __src = __archive_read_ahead(a,size,(ssize_t *)0x0);
    if (__src == (void *)0x0) {
      archive_set_error(&a->archive,0x16,"Truncated archive detected while reading metadata");
      *unconsumed = 0;
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      memcpy(as->s,__src,size);
      as->s[size] = '\0';
      as->length = size;
      *unconsumed = size + *unconsumed;
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_bytes_to_string(struct archive_read *a,
		     struct archive_string *as, size_t size,
		     size_t *unconsumed) {
	const void *src;

	/* Fail if we can't make our buffer big enough. */
	if (archive_string_ensure(as, (size_t)size+1) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory");
		return (ARCHIVE_FATAL);
	}

	tar_flush_unconsumed(a, unconsumed);

	/* Read the body into the string. */
	src = __archive_read_ahead(a, size, NULL);
	if (src == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "Truncated archive"
		    " detected while reading metadata");
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}
	memcpy(as->s, src, (size_t)size);
	as->s[size] = '\0';
	as->length = (size_t)size;
	*unconsumed += size;
	return (ARCHIVE_OK);
}